

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_Win_create(void *base,MPIABI_Aint size,int disp_unit,MPIABI_Info info,MPIABI_Comm comm,
                     MPIABI_Win *win)

{
  int iVar1;
  
  iVar1 = MPI_Win_create();
  return iVar1;
}

Assistant:

int MPIABI_Win_create(
  void * base,
  MPIABI_Aint size,
  int disp_unit,
  MPIABI_Info info,
  MPIABI_Comm comm,
  MPIABI_Win * win
) {
  return MPI_Win_create(
    base,
    (MPI_Aint)(WPI_Aint)size,
    disp_unit,
    (MPI_Info)(WPI_Info)info,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Win *)(WPI_WinPtr)win
  );
}